

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_4,_4> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,Matrix<float,_4,_4> *mat)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  ulong uVar9;
  Vector<float,_4> *pVVar10;
  bool bVar11;
  Vector<float,_2> *pVVar12;
  bool bVar13;
  int row;
  float *pfVar14;
  float *pfVar15;
  Vector<float,_2> *pVVar16;
  float *pfVar17;
  float *pfVar18;
  undefined1 *puVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  long lVar23;
  float v_9;
  float fVar24;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float v;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  Matrix<float,_2,_2> res_5;
  float local_118 [8];
  undefined1 local_f8 [16];
  float local_e8 [12];
  float local_b8 [4];
  float local_a8 [4];
  float local_98 [6];
  Matrix<float,_2,_2> res_3;
  Matrix<float,_2,_2> res;
  Matrix<float,_2,_2> retVal;
  Matrix<float,_2,_2> res_2;
  Matrix<float,_2,_2> res_1;
  undefined1 auVar28 [16];
  
  fVar32 = (mat->m_data).m_data[0].m_data[0];
  fVar31 = (mat->m_data).m_data[1].m_data[0];
  fVar33 = (mat->m_data).m_data[1].m_data[1];
  fVar7 = (mat->m_data).m_data[2].m_data[2];
  fVar8 = (mat->m_data).m_data[2].m_data[3];
  uVar2 = *(undefined8 *)((mat->m_data).m_data[3].m_data + 2);
  uVar3 = *(undefined8 *)(mat->m_data).m_data[3].m_data;
  uVar4 = *(undefined8 *)((mat->m_data).m_data[1].m_data + 2);
  puVar1 = local_f8 + 8;
  fVar35 = -(mat->m_data).m_data[0].m_data[1];
  fVar34 = fVar32 * fVar33 + fVar31 * fVar35;
  auVar30._4_4_ = fVar35;
  auVar30._0_4_ = fVar33;
  auVar30._8_4_ = -fVar31;
  auVar30._12_4_ = fVar32;
  auVar26._4_4_ = fVar34;
  auVar26._0_4_ = fVar34;
  auVar26._8_4_ = fVar34;
  auVar26._12_4_ = fVar34;
  local_f8 = divps(auVar30,auVar26);
  pfVar17 = local_98 + 2;
  local_98[0] = (mat->m_data).m_data[2].m_data[0];
  local_98[1] = (mat->m_data).m_data[2].m_data[1];
  local_98[2] = (float)(int)uVar3;
  local_98[3] = (float)(int)((ulong)uVar3 >> 0x20);
  local_a8[0] = (mat->m_data).m_data[0].m_data[2];
  local_a8[1] = (mat->m_data).m_data[0].m_data[3];
  local_a8[2] = (float)(int)uVar4;
  local_a8[3] = (float)(int)((ulong)uVar4 >> 0x20);
  local_118[4] = 1.0;
  local_118[5] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 1.0;
  pfVar15 = local_118 + 4;
  pfVar14 = local_a8;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    puVar19 = local_f8;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar32 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar32 = fVar32 + pfVar14[lVar20 * 2] * *(float *)(puVar19 + lVar20 * 4);
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pfVar15[lVar23 * 2] = fVar32;
      lVar23 = 1;
      puVar19 = puVar1;
      bVar11 = false;
    } while (bVar22);
    pfVar15 = local_118 + 5;
    pfVar14 = local_a8 + 1;
    bVar11 = false;
  } while (bVar21);
  pfVar15 = local_e8 + 4;
  local_e8[4] = 1.0;
  local_e8[5] = 0.0;
  local_e8[6] = 0.0;
  local_e8[7] = 1.0;
  pfVar14 = local_118 + 4;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    pfVar18 = local_98;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar32 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar32 = fVar32 + pfVar14[lVar20 * 2] * pfVar18[lVar20];
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pfVar15[lVar23 * 2] = fVar32;
      lVar23 = 1;
      pfVar18 = pfVar17;
      bVar11 = false;
    } while (bVar22);
    pfVar15 = local_e8 + 5;
    pfVar14 = local_118 + 5;
    bVar11 = false;
  } while (bVar21);
  fVar24 = fVar7 - (float)local_e8._16_8_;
  fVar27 = fVar8 - SUB84(local_e8._16_8_,4);
  fVar32 = (float)uVar2 - (float)local_e8._24_8_;
  fVar31 = (float)((ulong)uVar2 >> 0x20) - SUB84(local_e8._24_8_,4);
  res_3.m_data.m_data[1].m_data[0] = fVar24;
  res_3.m_data.m_data[1].m_data[1] = fVar27;
  uVar9 = CONCAT44(fVar24,fVar27);
  auVar25._0_8_ = uVar9 ^ 0x80000000;
  auVar25._8_4_ = 0x80000000;
  auVar25._12_4_ = 0;
  fVar33 = fVar24 * fVar31 - fVar32 * fVar27;
  auVar29._4_8_ = 0;
  auVar29._0_4_ = fVar31;
  auVar29._12_4_ = 0x80000000;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._0_8_ = CONCAT44(fVar32,fVar31) ^ 0x8000000000000000;
  auVar5._4_4_ = fVar33;
  auVar5._0_4_ = fVar33;
  auVar5._8_4_ = fVar33;
  auVar5._12_4_ = fVar33;
  auVar30 = divps(auVar28,auVar5);
  auVar6._4_4_ = fVar33;
  auVar6._0_4_ = fVar33;
  auVar6._8_4_ = fVar33;
  auVar6._12_4_ = fVar33;
  auVar26 = divps(auVar25,auVar6);
  local_b8[0] = auVar30._0_4_;
  local_b8[1] = auVar26._0_4_;
  local_b8[2] = auVar30._4_4_;
  local_b8[3] = auVar26._4_4_;
  pfVar15 = local_e8;
  local_e8[0] = 1.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 1.0;
  puVar19 = local_f8;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    pfVar14 = local_98;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar32 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar32 = fVar32 + *(float *)(puVar19 + lVar20 * 8) * pfVar14[lVar20];
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pfVar15[lVar23 * 2] = fVar32;
      lVar23 = 1;
      pfVar14 = pfVar17;
      bVar11 = false;
    } while (bVar22);
    pfVar15 = local_e8 + 1;
    puVar19 = local_f8 + 4;
    bVar11 = false;
  } while (bVar21);
  local_118[0] = 1.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 1.0;
  pfVar15 = local_e8;
  pfVar14 = local_118;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    pfVar18 = local_b8;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar32 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar32 = fVar32 + pfVar15[lVar20 * 2] * pfVar18[lVar20];
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pfVar14[lVar23 * 2] = fVar32;
      lVar23 = 1;
      pfVar18 = local_b8 + 2;
      bVar11 = false;
    } while (bVar22);
    pfVar15 = local_e8 + 1;
    pfVar14 = local_118 + 1;
    bVar11 = false;
  } while (bVar21);
  pfVar15 = local_118 + 4;
  local_118[4] = 1.0;
  local_118[5] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 1.0;
  pfVar14 = local_118;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    pfVar18 = local_a8;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar32 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar32 = fVar32 + pfVar14[lVar20 * 2] * pfVar18[lVar20];
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pfVar15[lVar23 * 2] = fVar32;
      lVar23 = 1;
      pfVar18 = local_a8 + 2;
      bVar11 = false;
    } while (bVar22);
    pfVar15 = local_118 + 5;
    pfVar14 = local_118 + 1;
    bVar11 = false;
  } while (bVar21);
  pVVar12 = res_3.m_data.m_data + 1;
  res_3.m_data.m_data[1].m_data[0] = 1.0;
  res_3.m_data.m_data[1].m_data[1] = 0.0;
  pfVar15 = local_118 + 4;
  pVVar16 = (Vector<float,_2> *)(res_3.m_data.m_data[1].m_data + 1);
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    puVar19 = local_f8;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar32 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar32 = fVar32 + pfVar15[lVar20 * 2] * *(float *)(puVar19 + lVar20 * 4);
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pVVar12[lVar23].m_data[0] = fVar32;
      lVar23 = 1;
      puVar19 = puVar1;
      bVar11 = false;
    } while (bVar22);
    pfVar15 = local_118 + 5;
    pVVar12 = (Vector<float,_2> *)(res_3.m_data.m_data[1].m_data + 1);
    bVar11 = false;
  } while (bVar21);
  fVar32 = res_3.m_data.m_data[1].m_data[0];
  pfVar15 = local_118;
  local_118[1] = 0.0 - local_f8._4_4_;
  local_118[0] = 0.0 - local_f8._0_4_;
  local_118[3] = 0.0 - local_f8._12_4_;
  local_118[2] = 0.0 - local_f8._8_4_;
  res_3.m_data.m_data[1].m_data[0] = 1.0;
  res_3.m_data.m_data[1].m_data[1] = 0.0;
  pVVar12 = res_3.m_data.m_data + 1;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    pfVar14 = local_98;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar31 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar31 = fVar31 + pfVar15[lVar20 * 2] * pfVar14[lVar20];
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pVVar12[lVar23].m_data[0] = fVar31;
      lVar23 = 1;
      pfVar14 = pfVar17;
      bVar11 = false;
    } while (bVar22);
    pfVar15 = local_118 + 1;
    pVVar12 = pVVar16;
    bVar11 = false;
  } while (bVar21);
  local_118[4] = 1.0;
  local_118[5] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 1.0;
  pfVar17 = local_118 + 4;
  pVVar12 = res_3.m_data.m_data + 1;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    pfVar15 = local_b8;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar31 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar31 = fVar31 + pVVar12[lVar20].m_data[0] * pfVar15[lVar20];
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pfVar17[lVar23 * 2] = fVar31;
      lVar23 = 1;
      pfVar15 = local_b8 + 2;
      bVar11 = false;
    } while (bVar22);
    pfVar17 = local_118 + 5;
    pVVar12 = pVVar16;
    bVar11 = false;
  } while (bVar21);
  local_e8[1] = 0.0 - auVar26._0_4_;
  local_e8[0] = 0.0 - auVar30._0_4_;
  local_e8[3] = 0.0 - auVar26._4_4_;
  local_e8[2] = 0.0 - auVar30._4_4_;
  res_3.m_data.m_data[1].m_data[0] = 1.0;
  res_3.m_data.m_data[1].m_data[1] = 0.0;
  pVVar12 = (Vector<float,_2> *)(res_3.m_data.m_data[1].m_data + 1);
  pVVar16 = res_3.m_data.m_data + 1;
  pfVar17 = local_e8;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    pfVar15 = local_a8;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar31 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar31 = fVar31 + pfVar17[lVar20 * 2] * pfVar15[lVar20];
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pVVar16[lVar23].m_data[0] = fVar31;
      lVar23 = 1;
      pfVar15 = local_a8 + 2;
      bVar11 = false;
    } while (bVar22);
    pVVar16 = pVVar12;
    pfVar17 = local_e8 + 1;
    bVar11 = false;
  } while (bVar21);
  local_118[0] = 1.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 1.0;
  pfVar17 = local_118;
  pVVar16 = res_3.m_data.m_data + 1;
  bVar11 = true;
  do {
    bVar21 = bVar11;
    lVar23 = 0;
    puVar19 = local_f8;
    bVar11 = true;
    do {
      bVar22 = bVar11;
      fVar31 = 0.0;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        fVar31 = fVar31 + pVVar16[lVar20].m_data[0] * *(float *)(puVar19 + lVar20 * 4);
        lVar20 = 1;
        bVar11 = false;
      } while (bVar13);
      pfVar17[lVar23 * 2] = fVar31;
      lVar23 = 1;
      puVar19 = puVar1;
      bVar11 = false;
    } while (bVar22);
    pfVar17 = local_118 + 1;
    pVVar16 = pVVar12;
    bVar11 = false;
  } while (bVar21);
  pVVar12 = res_3.m_data.m_data + 1;
  res_3.m_data.m_data[1].m_data[0] = fVar32 + local_f8._0_4_;
  res_3.m_data.m_data[1].m_data[1] = local_f8._8_4_ + 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  pVVar10 = (__return_storage_ptr__->m_data).m_data;
  pVVar10[3].m_data[2] = 0.0;
  pVVar10[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar10 = (__return_storage_ptr__->m_data).m_data;
  pVVar10[2].m_data[2] = 0.0;
  pVVar10[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar10 = (__return_storage_ptr__->m_data).m_data;
  pVVar10[1].m_data[2] = 0.0;
  pVVar10[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar23 = 0;
  pfVar17 = (float *)__return_storage_ptr__;
  do {
    lVar20 = 0;
    do {
      pfVar17[lVar20] = *(float *)((long)pVVar12->m_data + lVar20);
      lVar20 = lVar20 + 4;
    } while (lVar20 != 0x10);
    lVar23 = lVar23 + 1;
    pfVar17 = pfVar17 + 1;
    pVVar12 = pVVar12 + 2;
  } while (lVar23 != 4);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<float, 4, 4> inverse<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2*2] =
	{
		mat(0,2),	mat(0,3),
		mat(1,2),	mat(1,3)
	};
	const float areaC[2*2] =
	{
		mat(2,0),	mat(2,1),
		mat(3,0),	mat(3,1)
	};
	const float areaD[2*2] =
	{
		mat(2,2),	mat(2,3),
		mat(3,2),	mat(3,3)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2> invA = inverse(Mat2(areaA));
	const tcu::Matrix<float, 2, 2> matB =         Mat2(areaB);
	const tcu::Matrix<float, 2, 2> matC =         Mat2(areaC);
	const tcu::Matrix<float, 2, 2> matD =         Mat2(areaD);

	const tcu::Matrix<float, 2, 2> schurComplement = inverse(matD - matC*invA*matB);
	const tcu::Matrix<float, 2, 2> zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2> blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 2> blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 2, 2> blockC = (zeroMat-schurComplement)*matC*invA;
	const tcu::Matrix<float, 2, 2> blockD = schurComplement;

	const float result[4*4] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),	blockB(0,1),
		blockA(1,0),	blockA(1,1),	blockB(1,0),	blockB(1,1),
		blockC(0,0),	blockC(0,1),	blockD(0,0),	blockD(0,1),
		blockC(1,0),	blockC(1,1),	blockD(1,0),	blockD(1,1),
	};

	return Mat4(result);
}